

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.h
# Opt level: O3

Relations dg::vr::RelationsAnalyzer::getCommonByPointedTo<llvm::Value_const*>
                    (VectorSet<const_llvm::Value_*> *froms,
                    vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
                    *changeLocations,Value **val,Relations rels)

{
  VRLocation *pVVar1;
  bool bVar2;
  pointer ppVVar3;
  HandlePtr pBVar4;
  Relations RVar5;
  ulong uVar6;
  ulong uVar7;
  
  ppVVar3 = (changeLocations->
            super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (8 < (ulong)((long)(changeLocations->
                        super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar3)) {
    uVar6 = 1;
    uVar7 = 2;
    do {
      pVVar1 = ppVVar3[uVar6];
      pBVar4 = getCorrespondingByContent(&pVVar1->relations,froms);
      if (pBVar4 == (HandlePtr)0x0) {
        return (Relations)0;
      }
      RVar5 = ValueRelations::_between
                        (&pVVar1->relations,
                         ((pBVar4->relatedBuckets)._M_elems[10].vec.
                          super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_data,*val);
      rels.bits.super__Base_bitset<1UL>._M_w =
           (bitset<12UL>)
           ((ulong)rels.bits.super__Base_bitset<1UL>._M_w &
           (ulong)RVar5.bits.super__Base_bitset<1UL>._M_w);
      if (rels.bits.super__Base_bitset<1UL>._M_w == (_Base_bitset<1UL>)0x0) {
        return (Relations)0;
      }
      ppVVar3 = (changeLocations->
                super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      bVar2 = uVar7 < (ulong)((long)(changeLocations->
                                    super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar3 >> 3
                             );
      uVar6 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar2);
  }
  return (Relations)(_WordT)rels.bits.super__Base_bitset<1UL>._M_w;
}

Assistant:

static Relations
    getCommonByPointedTo(const VectorSet<V> &froms,
                         const std::vector<const VRLocation *> &changeLocations,
                         const X &val, Relations rels) {
        for (unsigned i = 1; i < changeLocations.size(); ++i) {
            const ValueRelations &graph = changeLocations[i]->relations;
            HandlePtr from = getCorrespondingByContent(graph, froms);
            if (!from)
                return Relations();
            assert(graph.hasLoad(*from));
            Handle loaded = graph.getPointedTo(*from);

            rels &= graph.between(loaded, val);
            if (!rels.any())
                break;
        }
        return rels;
    }